

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

void __thiscall
ExtraData::parseCURRENCY
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  ostream *poVar1;
  longlong lVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"MUST be a CURRENCY (Packet Version).");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"              Value:                ");
  std::operator<<((ostream *)&std::cout,"$ ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_38,val);
  lVar2 = Utils::vectEightBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_38,pos);
  poVar1 = std::ostream::_M_insert<double>((double)lVar2 / 10000.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_38);
  return;
}

Assistant:

void ExtraData::parseCURRENCY(std::vector<unsigned int> val, int pos) {
    cout << Utils::defaultOffsetDocInfo << "MUST be a CURRENCY (Packet Version)." << endl;
    cout << "              Value:                ";
    cout << "$ " << (double)Utils::vectEightBytesToUnsignedInt(val, pos)/10000 << endl;
}